

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

uint32_t SSL_get_dtls_handshake_read_seq(SSL *ssl)

{
  int iVar1;
  uint local_14;
  SSL *ssl_local;
  
  iVar1 = SSL_is_dtls(ssl);
  if (iVar1 == 0) {
    abort();
  }
  if ((*(ushort *)ssl->d1 >> 4 & 1) == 0) {
    local_14 = (uint)ssl->d1->handshake_read_seq;
  }
  else {
    local_14 = 0x10000;
  }
  return local_14;
}

Assistant:

uint32_t SSL_get_dtls_handshake_read_seq(const SSL *ssl) {
  BSSL_CHECK(SSL_is_dtls(ssl));
  return ssl->d1->handshake_read_overflow
             ? uint32_t{0x10000}
             : uint32_t{ssl->d1->handshake_read_seq};
}